

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

void __thiscall booster::aio::const_buffer::const_buffer(const_buffer *this,mutable_buffer *other)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  pointer peVar5;
  ulong uVar6;
  
  (this->super_buffer_impl<const_char_*>).size_ = 0;
  (this->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (other->super_buffer_impl<char_*>).size_;
  if (iVar1 == 0) {
    peVar5 = (pointer)0x0;
    uVar6 = 0;
  }
  else if (iVar1 == 1) {
    peVar5 = &(other->super_buffer_impl<char_*>).entry_;
    uVar6 = 1;
  }
  else {
    peVar5 = (other->super_buffer_impl<char_*>).vec_.
             super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(other->super_buffer_impl<char_*>).vec_.
                  super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)peVar5 >> 4;
  }
  if (uVar6 != 0) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      buffer_impl<const_char_*>::add
                (&this->super_buffer_impl<const_char_*>,peVar5[uVar3].ptr,peVar5[uVar3].size);
      bVar2 = uVar4 < uVar6;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

const_buffer(mutable_buffer const &other) 
			{
				mutable_buffer::buffer_data_type data = other.get();
				for(unsigned i=0;i<data.second;i++)
					add(data.first[i].ptr,data.first[i].size);
			}